

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O3

knote * knote_index_RB_REMOVE(knote_index *head,knote *elm)

{
  knote *pkVar1;
  knote *pkVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  anon_struct_32_4_548b78d9_for_kn_index *paVar6;
  knote *elm_00;
  knote *parent;
  knote *pkVar7;
  
  pkVar7 = (elm->kn_index).rbe_left;
  elm_00 = (elm->kn_index).rbe_right;
  if (pkVar7 == (knote *)0x0) {
    parent = (elm->kn_index).rbe_parent;
    iVar5 = (elm->kn_index).rbe_color;
    if (elm_00 != (knote *)0x0) goto LAB_00103a8c;
    elm_00 = (knote *)0x0;
  }
  else {
    if (elm_00 != (knote *)0x0) {
      do {
        pkVar7 = elm_00;
        elm_00 = (pkVar7->kn_index).rbe_left;
      } while (elm_00 != (knote *)0x0);
      elm_00 = (pkVar7->kn_index).rbe_right;
      parent = (pkVar7->kn_index).rbe_parent;
      iVar5 = (pkVar7->kn_index).rbe_color;
      if (elm_00 != (knote *)0x0) {
        (elm_00->kn_index).rbe_parent = parent;
      }
      paVar6 = (anon_struct_32_4_548b78d9_for_kn_index *)head;
      if (parent != (knote *)0x0) {
        paVar6 = (anon_struct_32_4_548b78d9_for_kn_index *)&(parent->kn_index).rbe_right;
        if ((parent->kn_index).rbe_left == pkVar7) {
          paVar6 = &parent->kn_index;
        }
      }
      paVar6->rbe_left = elm_00;
      if ((pkVar7->kn_index).rbe_parent == elm) {
        parent = pkVar7;
      }
      pkVar1 = (elm->kn_index).rbe_left;
      pkVar2 = (elm->kn_index).rbe_right;
      iVar3 = (elm->kn_index).rbe_color;
      uVar4 = *(undefined4 *)&(elm->kn_index).field_0x1c;
      (pkVar7->kn_index).rbe_parent = (elm->kn_index).rbe_parent;
      (pkVar7->kn_index).rbe_color = iVar3;
      *(undefined4 *)&(pkVar7->kn_index).field_0x1c = uVar4;
      (pkVar7->kn_index).rbe_left = pkVar1;
      (pkVar7->kn_index).rbe_right = pkVar2;
      pkVar1 = (elm->kn_index).rbe_parent;
      paVar6 = (anon_struct_32_4_548b78d9_for_kn_index *)head;
      if (pkVar1 != (knote *)0x0) {
        paVar6 = (anon_struct_32_4_548b78d9_for_kn_index *)&(pkVar1->kn_index).rbe_right;
        if ((pkVar1->kn_index).rbe_left == elm) {
          paVar6 = &pkVar1->kn_index;
        }
      }
      paVar6->rbe_left = pkVar7;
      (((elm->kn_index).rbe_left)->kn_index).rbe_parent = pkVar7;
      pkVar1 = (elm->kn_index).rbe_right;
      if (pkVar1 != (knote *)0x0) {
        (pkVar1->kn_index).rbe_parent = pkVar7;
      }
      goto LAB_00103ab3;
    }
    parent = (elm->kn_index).rbe_parent;
    iVar5 = (elm->kn_index).rbe_color;
    elm_00 = pkVar7;
LAB_00103a8c:
    (elm_00->kn_index).rbe_parent = parent;
  }
  if (parent == (knote *)0x0) {
    parent = (knote *)0x0;
    paVar6 = (anon_struct_32_4_548b78d9_for_kn_index *)head;
  }
  else {
    paVar6 = (anon_struct_32_4_548b78d9_for_kn_index *)&(parent->kn_index).rbe_right;
    if ((parent->kn_index).rbe_left == elm) {
      paVar6 = &parent->kn_index;
    }
  }
  paVar6->rbe_left = elm_00;
LAB_00103ab3:
  if (iVar5 == 0) {
    knote_index_RB_REMOVE_COLOR(head,parent,elm_00);
  }
  return elm;
}

Assistant:

struct knote *
knote_new(void)
{
    struct knote *res;

    res = calloc(1, sizeof(struct knote));
    if (res == NULL)
        return (NULL);

    res->kn_ref = 1;

    return (res);
}